

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int launch_obj(short otyp,int x1,int y1,int x2,int y2,int style)

{
  monst *mtmp;
  level *plVar1;
  int iVar2;
  boolean bVar3;
  schar sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  obj *poVar10;
  obj *obj;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  trap *trap;
  long lVar11;
  ulong uVar12;
  long lVar13;
  char cVar14;
  char cVar15;
  undefined6 in_register_0000003a;
  char *pcVar16;
  ulong uVar17;
  obj *local_88;
  int local_7c;
  int local_78;
  uint local_74;
  int local_70;
  undefined4 local_6c;
  undefined8 local_68;
  int local_5c;
  undefined8 local_58;
  d_level dest;
  obj *local_48;
  
  iVar8 = (int)CONCAT62(in_register_0000003a,otyp);
  local_70 = y2;
  poVar10 = sobj_at(0x214,level,iVar8,x1);
  iVar6 = x1;
  iVar5 = iVar8;
  local_7c = y1;
  local_78 = x2;
  if ((poVar10 == (obj *)0x0) &&
     (poVar10 = sobj_at(0x214,level,y1,x2), iVar6 = x2, iVar5 = y1, local_7c = iVar8, local_78 = x1,
     poVar10 == (obj *)0x0)) {
    return 0;
  }
  if (poVar10->quan == 1) {
    obj_extract_self(poVar10);
    local_48 = (obj *)0x0;
    obj = poVar10;
  }
  else {
    obj = splitobj(poVar10,1);
    obj_extract_self(obj);
    local_48 = poVar10;
  }
  local_88 = obj;
  newsym(iVar5,iVar6);
  iVar2 = local_78;
  iVar8 = local_7c;
  if ((obj->ox == digging.pos.x) && (obj->oy == digging.pos.y)) {
    digging.effort = 0;
    digging.lastdigtime = 0;
    digging.level.dnum = '\0';
    digging.level.dlevel = '\0';
    digging.pos.x = '\0';
    digging.pos.y = '\0';
    digging.down = '\0';
    digging.chew = '\0';
    digging.warned = '\0';
    digging.quiet = '\0';
  }
  local_74 = distmin(iVar5,iVar6,local_7c,local_78);
  bhitpos.x = (xchar)iVar5;
  bhitpos.y = (xchar)iVar6;
  iVar5 = sgn(iVar8 - iVar5);
  local_68 = CONCAT44(extraout_var,iVar5);
  iVar6 = sgn(iVar2 - iVar6);
  local_58 = CONCAT44(extraout_var_00,iVar6);
  if (local_70 != 1) {
    if (local_70 == 0x81) {
      obj->field_0x4b = obj->field_0x4b | 0x80;
    }
    else {
      if (local_70 != 0x41) {
        local_5c = 1;
        iVar6 = local_70;
        goto LAB_00255d44;
      }
      pcVar16 = "rumbling in the distance.";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar16 = "someone bowling.";
        }
        else {
          bVar3 = dmgtype(youmonst.data,0x24);
          pcVar16 = "rumbling in the distance.";
          if (bVar3 == '\0') {
            pcVar16 = "someone bowling.";
          }
        }
      }
      You_hear(pcVar16);
    }
  }
  local_5c = 2;
  iVar6 = 1;
LAB_00255d44:
  uVar12 = (ulong)local_74;
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    flush_screen();
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
    iVar5 = (int)obj->otyp;
  }
  else {
    iVar5 = display_rng(0x219);
    iVar5 = iVar5 + 1;
  }
  tmp_at(-4,iVar5 + 1);
  tmp_at((int)bhitpos.x,(int)bhitpos.y);
  uVar17 = uVar12;
  local_70 = iVar6;
LAB_00255de3:
  iVar6 = (int)uVar12;
  if (iVar6 < 1) {
    cVar14 = '\0';
    goto LAB_00256397;
  }
  tmp_at((int)bhitpos.x,(int)bhitpos.y);
  local_6c = (undefined4)CONCAT71((int7)(uVar17 >> 8),0 < iVar6);
  iVar5 = local_5c;
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
    for (; 0 < iVar5; iVar5 = iVar5 + -1) {
      (*windowprocs.win_delay)();
    }
  }
  plVar1 = level;
  local_74 = iVar6 - 1;
  cVar14 = bhitpos.x + (char)local_68;
  cVar15 = bhitpos.y + (char)local_58;
  bhitpos.x = cVar14;
  bhitpos.y = cVar15;
  trap = t_at(level,(int)cVar14,(int)cVar15);
  iVar5 = local_70;
  mtmp = plVar1->monsters[cVar14][cVar15];
  if ((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) {
    if (((mtmp->data->mflags2 & 0x8000000) == 0) || (uVar7 = mt_random(), uVar7 % 3 == 0)) {
      iVar5 = local_70;
      uVar7 = local_74;
      if (local_70 == 1) {
        uVar7 = 0xffffffff;
      }
      iVar8 = ohitmon((monst *)0x0,mtmp,local_88,local_48,uVar7,'\0');
      if (iVar8 == 0) goto LAB_00255f7a;
LAB_0025631e:
      cVar14 = (char)local_6c;
      goto LAB_00256397;
    }
    pcVar16 = Monnam(mtmp);
    pline("%s snatches the boulder.",pcVar16);
    *(uint *)&local_88->field_0x4a = *(uint *)&local_88->field_0x4a & 0xffff7fff;
    mpickobj(mtmp,local_88);
    goto LAB_00256391;
  }
  if ((cVar14 == u.ux) && (cVar15 == u.uy)) {
    if (multi != 0) {
      nomul(0,(char *)0x0);
    }
    cVar14 = local_88->spe;
    iVar8 = dmgval((monst *)0x0,local_88,'\x01',&youmonst);
    iVar8 = thitu(cVar14 + 9,iVar8,local_88,(obj *)0x0,(monst *)0x0,(char *)0x0);
    if (iVar8 != 0) {
      stop_occupation();
    }
  }
LAB_00255f7a:
  if (iVar5 != 1) {
    uVar17 = (ulong)local_74;
LAB_0025612e:
    bVar3 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y);
    if (bVar3 == '\0') {
      uVar12 = 0;
      if (iVar6 == 1) goto LAB_00255de3;
    }
    else {
      lVar11 = (long)bhitpos.y;
      lVar13 = (long)bhitpos.x;
      if ((viz_array[lVar11][lVar13] & 2U) != 0) {
        pline("The boulder crashes through a door.");
        lVar13 = (long)bhitpos.x;
        lVar11 = (long)bhitpos.y;
      }
      *(uint *)&level->locations[lVar13][lVar11].field_0x6 =
           *(uint *)&level->locations[lVar13][lVar11].field_0x6 & 0xfffffe0f | 0x10;
      uVar12 = 0;
      if ((int)uVar17 == 0) goto LAB_00255de3;
      unblock_point((int)bhitpos.x,(int)bhitpos.y);
    }
    iVar6 = (int)bhitpos.x;
    uVar12 = uVar17;
    if (((int)local_68 + iVar6) - 1U < 0x4f) {
      iVar5 = (int)bhitpos.y;
      uVar7 = (int)local_58 + iVar5;
      if ((uVar7 < 0x15) && (level->locations[(uint)((int)local_68 + iVar6)][uVar7].typ == '\x16'))
      {
        uVar7 = mt_random();
        bVar3 = hits_bars(&local_88,iVar6,iVar5,(int)local_68,(int)local_58,
                          (uint)(uVar7 % 0x14 == 0),0);
        local_7c = iVar6;
        local_78 = iVar5;
        if (bVar3 != '\0') {
          cVar14 = local_88 == (obj *)0x0;
          goto LAB_00256397;
        }
      }
    }
    goto LAB_00255de3;
  }
  sVar4 = down_gate(bhitpos.x,bhitpos.y);
  uVar7 = local_74;
  uVar12 = (ulong)local_74;
  if ((sVar4 != -1) && (bVar3 = ship_object(local_88,bhitpos.x,bhitpos.y,'\0'), bVar3 != '\0'))
  goto LAB_0025631e;
  uVar17 = uVar12;
  if (trap != (trap *)0x0) {
    uVar9 = (byte)trap->field_0x8 & 0x1f;
    if (uVar9 - 0x10 < 2) {
      if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
        You_hear("a rumbling stop abruptly.");
      }
      else {
        pline("Suddenly the rolling boulder disappears!");
      }
      *(uint *)&local_88->field_0x4a = *(uint *)&local_88->field_0x4a & 0xffff7fff;
      if ((trap->field_0x8 & 0x1f) == 0x10) {
        rloco(local_88);
        goto LAB_00256389;
      }
      iVar6 = random_teleport_level();
      sVar4 = depth(&u.uz);
      if ((iVar6 != sVar4) && (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
        get_level(&dest,iVar6);
        deliver_object(local_88,dest.dnum,dest.dlevel,0);
LAB_00256389:
        seetrap(trap);
LAB_00256391:
        cVar14 = '\x01';
LAB_00256397:
        iVar6 = 2;
        tmp_at(-6,0);
        iVar8 = local_78;
        iVar5 = local_7c;
        if (cVar14 == '\0') {
          *(uint *)&local_88->field_0x4a = *(uint *)&local_88->field_0x4a & 0xffff7fff;
          place_object(local_88,level,local_7c,local_78);
          newsym(iVar5,iVar8);
          iVar6 = 1;
        }
        return iVar6;
      }
      goto LAB_00255de3;
    }
    if (uVar9 == 6) {
      uVar9 = mt_random();
      if (uVar9 % 10 < 3) goto LAB_00256006;
      pcVar16 = " The rolling boulder triggers a land mine.";
      if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
        pcVar16 = "";
      }
      pline("KAABLAMM!!!%s",pcVar16);
      deltrap(level,trap);
      del_engr_at(level,(int)bhitpos.x,(int)bhitpos.y);
      place_object(local_88,level,(int)bhitpos.x,(int)bhitpos.y);
      *(uint *)&local_88->field_0x4a = *(uint *)&local_88->field_0x4a & 0xffff7fff;
      fracture_rock(local_88);
      scatter((int)bhitpos.x,(int)bhitpos.y,4,0x1f,(obj *)0x0);
      cVar14 = '\x01';
      if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
        newsym((int)bhitpos.x,(int)bhitpos.y);
      }
      goto LAB_00256397;
    }
    if (uVar9 - 0xb < 4) {
      local_7c = (int)bhitpos.x;
      local_78 = (int)bhitpos.y;
      bVar3 = flooreffects(local_88,local_7c,local_78,"fall");
      cVar14 = bVar3 != '\0';
      goto LAB_00256397;
    }
  }
LAB_00256006:
  bVar3 = flooreffects(local_88,(int)bhitpos.x,(int)bhitpos.y,"fall");
  if (bVar3 != '\0') goto LAB_0025631e;
  poVar10 = sobj_at(0x214,level,(int)bhitpos.x,(int)bhitpos.y);
  if (poVar10 == (obj *)0x0) goto LAB_0025612e;
  if (((int)local_68 + (int)bhitpos.x) - 1U < 0x4f) {
    uVar9 = bhitpos.y + (int)local_58;
    if (((((int)uVar9 < 0) || (0x14 < uVar9)) || (uVar7 == 0)) ||
       (pcVar16 = " as one boulder sets another in motion",
       level->locations[(uint)((int)bhitpos.x + (int)local_68)][uVar9].typ < '\x11'))
    goto LAB_0025609b;
  }
  else {
LAB_0025609b:
    pcVar16 = " as one boulder hits another";
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    pcVar16 = "";
  }
  You_hear("a loud crash%s!",pcVar16);
  obj_extract_self(poVar10);
  *(uint *)&poVar10->field_0x4a =
       *(uint *)&poVar10->field_0x4a & 0xffff7fff | *(uint *)&local_88->field_0x4a & 0x8000;
  local_88->field_0x4b = local_88->field_0x4b & 0x7f;
  place_object(local_88,level,(int)bhitpos.x,(int)bhitpos.y);
  local_88 = poVar10;
  wake_nearto((int)bhitpos.x,(int)bhitpos.y,100);
  goto LAB_0025612e;
}

Assistant:

int launch_obj(short otyp, int x1, int y1, int x2, int y2, int style)
{
	struct monst *mtmp;
	struct obj *otmp, *otmp2;
	int dx, dy;
	struct obj *singleobj, *ostack;
	boolean used_up = FALSE;
	boolean otherside = FALSE;
	int dist;
	int tmp;
	int delaycnt = 0;

	otmp = sobj_at(otyp, level, x1, y1);
	/* Try the other side too, for rolling boulder traps */
	if (!otmp && otyp == BOULDER) {
		otherside = TRUE;
		otmp = sobj_at(otyp, level, x2, y2);
	}
	if (!otmp) return 0;
	if (otherside) {	/* swap 'em */
		int tx, ty;

		tx = x1; ty = y1;
		x1 = x2; y1 = y2;
		x2 = tx; y2 = ty;
	}

	if (otmp->quan == 1L) {
	    ostack = NULL;
	    obj_extract_self(otmp);
	    singleobj = otmp;
	    otmp = NULL;
	} else {
	    ostack = otmp;
	    singleobj = splitobj(otmp, 1L);
	    obj_extract_self(singleobj);
	}
	newsym(x1,y1);
	/* in case you're using a pick-axe to chop the boulder that's being
	   launched (perhaps a monster triggered it), destroy context so that
	   next dig attempt never thinks you're resuming previous effort */
	if ((otyp == BOULDER || otyp == STATUE) &&
	    singleobj->ox == digging.pos.x && singleobj->oy == digging.pos.y)
	    memset(&digging, 0, sizeof digging);

	dist = distmin(x1,y1,x2,y2);
	bhitpos.x = x1;
	bhitpos.y = y1;
	dx = sgn(x2 - x1);
	dy = sgn(y2 - y1);
	switch (style) {
	    case ROLL|LAUNCH_UNSEEN:
			if (otyp == BOULDER) {
			    You_hear(Hallucination ?
				     "someone bowling." :
				     "rumbling in the distance.");
			}
			style &= ~LAUNCH_UNSEEN;
			goto roll;
	    case ROLL|LAUNCH_KNOWN:
			/* use otrapped as a flag to ohitmon */
			singleobj->otrapped = 1;
			style &= ~LAUNCH_KNOWN;
			/* fall through */
	    roll:
	    case ROLL:
			delaycnt = 2;
			/* fall through */
	    default:
			if (!delaycnt)
			    delaycnt = 1;
			if (!cansee(bhitpos.x,bhitpos.y))
			    flush_screen();
			
			tmp_at(DISP_OBJECT, dbuf_objid(singleobj));
			tmp_at(bhitpos.x, bhitpos.y);
	}

	/* Set the object in motion */
	while (dist-- > 0 && !used_up) {
		struct trap *t;
		tmp_at(bhitpos.x, bhitpos.y);
		tmp = delaycnt;

		/* dstage@u.washington.edu -- Delay only if hero sees it */
		if (cansee(bhitpos.x, bhitpos.y))
			while (tmp-- > 0) win_delay_output();

		bhitpos.x += dx;
		bhitpos.y += dy;
		t = t_at(level, bhitpos.x, bhitpos.y);
		
		if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
			if (otyp == BOULDER && throws_rocks(mtmp->data)) {
			    if (rn2(3)) {
				pline("%s snatches the boulder.",
					Monnam(mtmp));
				singleobj->otrapped = 0;
				mpickobj(mtmp, singleobj);
				used_up = TRUE;
				break;
			    }
			}
			if (ohitmon(NULL, mtmp, singleobj, ostack,
					(style==ROLL) ? -1 : dist, FALSE)) {
				used_up = TRUE;
				break;
			}
		} else if (bhitpos.x == u.ux && bhitpos.y == u.uy) {
			if (multi) nomul(0, NULL);
			if (thitu(9 + singleobj->spe,
				  dmgval(NULL, singleobj, TRUE, &youmonst),
				  singleobj, NULL, NULL, NULL)) {
			    stop_occupation();
			}
		}
		if (style == ROLL) {
		    if (down_gate(bhitpos.x, bhitpos.y) != -1) {
		        if (ship_object(singleobj, bhitpos.x, bhitpos.y, FALSE)){
				used_up = TRUE;
				break;
			}
		    }
		    if (t && otyp == BOULDER) {
			switch(t->ttyp) {
			case LANDMINE:
			    if (rn2(10) > 2) {
			  	pline(
				  "KAABLAMM!!!%s",
				  cansee(bhitpos.x, bhitpos.y) ?
					" The rolling boulder triggers a land mine." : "");
				deltrap(level, t);
				del_engr_at(level, bhitpos.x,bhitpos.y);
				place_object(singleobj, level, bhitpos.x, bhitpos.y);
				singleobj->otrapped = 0;
				fracture_rock(singleobj);
				scatter(bhitpos.x,bhitpos.y, 4,
					MAY_DESTROY|MAY_HIT|MAY_FRACTURE|VIS_EFFECTS,
					NULL);
				if (cansee(bhitpos.x,bhitpos.y))
					newsym(bhitpos.x,bhitpos.y);
			        used_up = TRUE;
			    }
			    break;		
			case LEVEL_TELEP:
			case TELEP_TRAP:
			    if (cansee(bhitpos.x, bhitpos.y))
			    	pline("Suddenly the rolling boulder disappears!");
			    else
			    	You_hear("a rumbling stop abruptly.");
			    singleobj->otrapped = 0;
			    if (t->ttyp == TELEP_TRAP)
				rloco(singleobj);
			    else {
				int newlev = random_teleport_level();
				d_level dest;

				if (newlev == depth(&u.uz) || In_endgame(&u.uz))
				    continue;
				get_level(&dest, newlev);
				deliver_object(singleobj, dest.dnum, dest.dlevel,
					       MIGR_RANDOM);
			    }
			    seetrap(t);
			    used_up = TRUE;
			    break;
			case PIT:
			case SPIKED_PIT:
			case HOLE:
			case TRAPDOOR:
			    /* the boulder won't be used up if there is a
			       monster in the trap; stop rolling anyway */
			    x2 = bhitpos.x,  y2 = bhitpos.y;  /* stops here */
			    if (flooreffects(singleobj, x2, y2, "fall"))
				used_up = TRUE;
			    dist = -1;	/* stop rolling immediately */
			    break;
			}
			if (used_up || dist == -1) break;
		    }
		    if (flooreffects(singleobj, bhitpos.x, bhitpos.y, "fall")) {
			used_up = TRUE;
			break;
		    }
		    if (otyp == BOULDER &&
		       (otmp2 = sobj_at(BOULDER, level, bhitpos.x, bhitpos.y)) != 0) {
			const char *bmsg =
				     " as one boulder sets another in motion";

			if (!isok(bhitpos.x + dx, bhitpos.y + dy) || !dist ||
			    IS_ROCK(level->locations[bhitpos.x + dx][bhitpos.y + dy].typ))
			    bmsg = " as one boulder hits another";

			You_hear("a loud crash%s!",
				cansee(bhitpos.x, bhitpos.y) ? bmsg : "");
			obj_extract_self(otmp2);
			/* pass off the otrapped flag to the next boulder */
			otmp2->otrapped = singleobj->otrapped;
			singleobj->otrapped = 0;
			place_object(singleobj, level, bhitpos.x, bhitpos.y);
			singleobj = otmp2;
			otmp2 = NULL;
			wake_nearto(bhitpos.x, bhitpos.y, 10*10);
		    }
		}
		if (otyp == BOULDER && closed_door(level, bhitpos.x,bhitpos.y)) {
			if (cansee(bhitpos.x, bhitpos.y))
				pline("The boulder crashes through a door.");
			level->locations[bhitpos.x][bhitpos.y].doormask = D_BROKEN;
			if (dist) unblock_point(bhitpos.x, bhitpos.y);
		}

		/* if about to hit iron bars, do so now */
		if (dist > 0 && isok(bhitpos.x + dx,bhitpos.y + dy) &&
			level->locations[bhitpos.x + dx][bhitpos.y + dy].typ == IRONBARS) {
		    x2 = bhitpos.x,  y2 = bhitpos.y;	/* object stops here */
		    if (hits_bars(&singleobj, x2, y2, dx, dy, !rn2(20), 0)) {
			if (!singleobj) used_up = TRUE;
			break;
		    }
		}
	}
	tmp_at(DISP_END, 0);
	if (!used_up) {
		singleobj->otrapped = 0;
		place_object(singleobj, level, x2,y2);
		newsym(x2,y2);
		return 1;
	} else
		return 2;
}